

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathEuler.h
# Opt level: O2

void __thiscall Imath_2_5::Euler<double>::angleOrder(Euler<double> *this,int *i,int *j,int *k)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  
  bVar1 = (byte)this->field_0x18 >> 3 & 3;
  *i = (uint)bVar1;
  if ((this->field_0x18 & 4) == 0) {
    iVar3 = bVar1 - 1;
    if (bVar1 == 0) {
      iVar3 = 2;
    }
  }
  else {
    iVar3 = (uint)(bVar1 < 2) * 3 + (uint)bVar1 + -2;
  }
  *j = iVar3;
  iVar3 = *i;
  if ((this->field_0x18 & 4) == 0) {
    iVar2 = (iVar3 + 1) % 3;
  }
  else {
    iVar2 = 2;
    if (0 < iVar3) {
      iVar2 = iVar3 + -1;
    }
  }
  *k = iVar2;
  return;
}

Assistant:

inline void
 Euler<T>::angleOrder(int &i, int &j, int &k) const
{
    i = _initialAxis;
    j = _parityEven ? (i+1)%3 : (i > 0 ? i-1 : 2);
    k = _parityEven ? (i > 0 ? i-1 : 2) : (i+1)%3;
}